

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::MultiFab::OverlapMask(MultiFab *this,Periodicity *period)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FabFactory<amrex::FArrayBox> *factory;
  FArrayBox *pFVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  _Head_base<0UL,_amrex::MultiFab_*,_false> _Var14;
  FabArray<amrex::FArrayBox> *this_00;
  uint uVar15;
  pointer *ppbVar16;
  Periodicity *in_RDX;
  pointer ppVar17;
  long lVar18;
  pointer pIVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  void *__s;
  int iVar24;
  pointer *__ptr;
  bool bVar25;
  int iVar27;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  int iVar29;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r;
  MFIter mfi;
  undefined1 local_158 [16];
  pointer local_148;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_140;
  Box local_138;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_110;
  BoxArray *local_f8;
  pointer local_f0;
  long local_e8;
  double *local_e0;
  Array4<double> local_d8;
  undefined1 local_98 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  int local_70;
  Vector<int,_std::allocator<int>_> *local_58;
  
  local_98._1_7_ = 0;
  local_98[0] = true;
  local_98._8_8_ = (FabArrayBase *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  factory = *(FabFactory<amrex::FArrayBox> **)period[0x14].period.vect;
  this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
  local_f8 = (BoxArray *)((period->period).vect + 2);
  local_d8.p = (double *)0x0;
  local_d8.jstride._0_4_ = 0;
  MultiFab((MultiFab *)this_00,local_f8,(DistributionMapping *)(period[9].period.vect + 1),1,
           (IntVect *)&local_d8,(MFInfo *)local_98,factory);
  (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  Periodicity::shiftIntVect(&local_110,in_RDX);
  local_158 = (undefined1  [16])0x0;
  local_148 = (pointer)0x0;
  local_140._M_head_impl = this;
  MFIter::MFIter((MFIter *)local_98,(FabArrayBase *)this_00,'\0');
  if ((int)local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_70) {
    do {
      ppbVar16 = &local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_58 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar16 = (pointer *)
                   ((local_58->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      pFVar8 = (this_00->m_fabs_v).
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*(int *)ppbVar16];
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d8,this_00,(MFIter *)local_98);
      iVar1 = *(int *)((long)&(pFVar8->super_BaseFab<double>).domain.smallend + 8);
      iVar20 = *(int *)((long)&(pFVar8->super_BaseFab<double>).domain.bigend + 8);
      if (iVar1 <= iVar20) {
        iVar2 = (pFVar8->super_BaseFab<double>).domain.bigend.vect[0];
        iVar3 = *(int *)((long)&(pFVar8->super_BaseFab<double>).domain.bigend + 4);
        iVar4 = *(int *)((long)&(pFVar8->super_BaseFab<double>).domain.smallend + 4);
        iVar5 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[0];
        do {
          if (iVar4 <= iVar3) {
            lVar18 = CONCAT44(local_d8.jstride._4_4_,(undefined4)local_d8.jstride) * 8;
            __s = (void *)((long)local_d8.p +
                          ((long)iVar4 - (long)local_d8.begin.y) * lVar18 +
                          (iVar1 - local_d8.begin.z) * local_d8.kstride * 8 +
                          (long)local_d8.begin.x * -8 + (long)iVar5 * 8);
            iVar24 = (iVar3 - iVar4) + 1;
            do {
              if (iVar5 <= iVar2) {
                memset(__s,0,(ulong)(uint)(iVar2 - iVar5) * 8 + 8);
              }
              __s = (void *)((long)__s + lVar18);
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          bVar25 = iVar1 != iVar20;
          iVar1 = iVar1 + 1;
        } while (bVar25);
      }
      local_f0 = local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar19 = local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar9 = *(undefined8 *)(pFVar8->super_BaseFab<double>).domain.smallend.vect;
          uVar10 = *(undefined8 *)((long)&(pFVar8->super_BaseFab<double>).domain.smallend + 8);
          uVar11 = *(undefined8 *)((long)&(pFVar8->super_BaseFab<double>).domain.bigend + 8);
          local_138.bigend.vect[1] =
               (int)((ulong)*(undefined8 *)(pFVar8->super_BaseFab<double>).domain.bigend.vect >>
                    0x20);
          local_138.smallend.vect[2] = (int)uVar10;
          local_138.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
          local_138.smallend.vect[0] = (int)uVar9 + (int)*(undefined8 *)pIVar19->vect;
          local_138.smallend.vect[1] =
               (int)((ulong)uVar9 >> 0x20) + (int)((ulong)*(undefined8 *)pIVar19->vect >> 0x20);
          local_138.smallend.vect[2] = local_138.smallend.vect[2] + pIVar19->vect[2];
          local_138.bigend.vect[0] = local_138.bigend.vect[0] + pIVar19->vect[0];
          local_138.bigend.vect[1] = local_138.bigend.vect[1] + pIVar19->vect[1];
          local_138.bigend.vect[2] = (int)uVar11;
          local_138.btype.itype = (uint)((ulong)uVar11 >> 0x20);
          local_138.bigend.vect[2] = local_138.bigend.vect[2] + pIVar19->vect[2];
          BoxArray::intersections
                    (local_f8,&local_138,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)local_158);
          auVar13 = _DAT_0077bb40;
          auVar12 = _DAT_0077bb30;
          if (local_158._0_8_ != local_158._8_8_) {
            iVar1 = pIVar19->vect[2];
            local_e0 = local_d8.p + -(long)local_d8.begin.x;
            lVar18 = CONCAT44(local_d8.jstride._4_4_,(undefined4)local_d8.jstride) * 8;
            local_e8 = -(long)local_d8.begin.y;
            ppVar17 = (pointer)local_158._0_8_;
            do {
              iVar20 = (ppVar17->second).smallend.vect[2];
              iVar2 = (ppVar17->second).bigend.vect[2];
              if (iVar20 <= iVar2) {
                iVar3 = (ppVar17->second).bigend.vect[0];
                iVar4 = (ppVar17->second).bigend.vect[1];
                iVar5 = pIVar19->vect[1];
                iVar24 = pIVar19->vect[0];
                iVar6 = (ppVar17->second).smallend.vect[1];
                iVar7 = (ppVar17->second).smallend.vect[0];
                uVar15 = iVar3 - iVar7;
                auVar26._4_4_ = 0;
                auVar26._0_4_ = uVar15;
                auVar26._8_4_ = uVar15;
                auVar26._12_4_ = 0;
                auVar26 = auVar26 ^ auVar13;
                iVar20 = iVar20 - iVar1;
                do {
                  if (iVar6 <= iVar4) {
                    lVar23 = (long)local_e0 +
                             ((long)iVar20 - (long)local_d8.begin.z) * local_d8.kstride * 8 +
                             ((iVar6 + local_e8) - (long)iVar5) * lVar18 + (long)iVar7 * 8 +
                             (long)iVar24 * -8;
                    iVar21 = iVar6 - iVar5;
                    do {
                      if (iVar7 <= iVar3) {
                        uVar22 = 0;
                        do {
                          auVar28._8_4_ = (int)uVar22;
                          auVar28._0_8_ = uVar22;
                          auVar28._12_4_ = (int)(uVar22 >> 0x20);
                          auVar28 = (auVar28 | auVar12) ^ auVar13;
                          bVar25 = auVar26._0_4_ < auVar28._0_4_;
                          iVar27 = auVar26._4_4_;
                          iVar29 = auVar28._4_4_;
                          if ((bool)(~(iVar27 < iVar29 || iVar29 == iVar27 && bVar25) & 1)) {
                            *(double *)(lVar23 + uVar22 * 8) =
                                 *(double *)(lVar23 + uVar22 * 8) + 1.0;
                          }
                          if (iVar27 >= iVar29 && (iVar29 != iVar27 || !bVar25)) {
                            *(double *)(lVar23 + 8 + uVar22 * 8) =
                                 *(double *)(lVar23 + 8 + uVar22 * 8) + 1.0;
                          }
                          uVar22 = uVar22 + 2;
                        } while (((ulong)uVar15 + 2 & 0xfffffffffffffffe) != uVar22);
                      }
                      iVar21 = iVar21 + 1;
                      lVar23 = lVar23 + lVar18;
                    } while ((iVar4 - iVar5) + 1 != iVar21);
                  }
                  bVar25 = iVar20 != iVar2 - iVar1;
                  iVar20 = iVar20 + 1;
                } while (bVar25);
              }
              ppVar17 = ppVar17 + 1;
            } while (ppVar17 != (pointer)local_158._8_8_);
          }
          pIVar19 = pIVar19 + 1;
        } while (pIVar19 != local_f0);
      }
      MFIter::operator++((MFIter *)local_98);
    } while ((int)local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_70);
  }
  MFIter::~MFIter((MFIter *)local_98);
  if ((pointer)local_158._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_158._0_8_,(long)local_148 - local_158._0_8_);
  }
  _Var14._M_head_impl = local_140._M_head_impl;
  if (local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         _Var14._M_head_impl;
}

Assistant:

std::unique_ptr<MultiFab>
MultiFab::OverlapMask (const Periodicity& period) const
{
    BL_PROFILE("MultiFab::OverlapMask()");

    const BoxArray& ba = boxArray();
    const DistributionMapping& dm = DistributionMap();

    auto p = std::make_unique<MultiFab>(ba,dm,1,0, MFInfo(), Factory());

    const std::vector<IntVect>& pshifts = period.shiftIntVect();

    Vector<Array4BoxTag<Real> > tags;

    bool run_on_gpu = Gpu::inLaunchRegion();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        std::vector< std::pair<int,Box> > isects;

        for (MFIter mfi(*p); mfi.isValid(); ++mfi)
        {
            const Box& bx = (*p)[mfi].box();
            Array4<Real> const& arr = p->array(mfi);

            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                arr(i,j,k) = Real(0.0);
            });

            for (const auto& iv : pshifts)
            {
                ba.intersections(bx+iv, isects);
                for (const auto& is : isects)
                {
                    Box const& b = is.second-iv;
                    if (run_on_gpu) {
                        tags.push_back({arr,b});
                    } else {
                        amrex::LoopConcurrentOnCpu(b, [=] (int i, int j, int k) noexcept
                        {
                            arr(i,j,k) += Real(1.0);
                        });
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    amrex::ParallelFor(tags, 1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag) noexcept
    {
        Real* p = tag.dfab.ptr(i,j,k,n);
        Gpu::Atomic::AddNoRet(p, Real(1.0));
    });
#endif

    return p;
}